

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::AddSettingsHandler(ImGuiSettingsHandler *handler)

{
  ImGuiContext *pIVar1;
  ImGuiSettingsHandler *pIVar2;
  ImGuiContext *g;
  ImGuiSettingsHandler *handler_local;
  
  pIVar1 = GImGui;
  pIVar2 = FindSettingsHandler(handler->TypeName);
  if (pIVar2 == (ImGuiSettingsHandler *)0x0) {
    ImVector<ImGuiSettingsHandler>::push_back(&pIVar1->SettingsHandlers,handler);
    return;
  }
  __assert_fail("FindSettingsHandler(handler->TypeName) == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x3004,"void ImGui::AddSettingsHandler(const ImGuiSettingsHandler *)");
}

Assistant:

void ImGui::AddSettingsHandler(const ImGuiSettingsHandler* handler)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(FindSettingsHandler(handler->TypeName) == NULL);
    g.SettingsHandlers.push_back(*handler);
}